

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O3

ixy_device * ixgbe_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues,int interrupt_timeout)

{
  uint16_t *puVar1;
  uint8_t **ppuVar2;
  char cVar3;
  _Bool _Var4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __uid_t _Var8;
  int iVar9;
  uint uVar10;
  ixgbe_device *dev_00;
  char *pcVar11;
  uint8_t *puVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  pkt_buf *ppVar16;
  uint64_t uVar17;
  ulong uVar18;
  uint uVar19;
  ixy_device *piVar20;
  int iVar21;
  long extraout_RDX;
  long extraout_RDX_00;
  ixgbe_device *dev;
  ulong uVar22;
  byte bVar23;
  uint16_t uVar24;
  uint uVar25;
  interrupt_queues *interrupt;
  long *plVar26;
  uint uVar27;
  stat *__buf;
  ulong uVar28;
  ushort uVar29;
  FILE *dev_01;
  mempool *mempool;
  ulong uVar30;
  uint *puVar31;
  long lVar32;
  ixy_device *piVar33;
  long *plVar34;
  uint16_t *puVar35;
  uint16_t local_10d2;
  stat buffer;
  char path [4096];
  
  uVar10 = interrupt_timeout;
  uVar24 = rx_queues;
  _Var8 = getuid();
  if (_Var8 != 0) {
    ixgbe_init_cold_1();
  }
  if (rx_queues < 0x41) {
    dev_01 = (FILE *)pci_addr;
    if (tx_queues < 0x41) {
      dev_00 = (ixgbe_device *)malloc(0x88);
      dev_01 = (FILE *)pci_addr;
      pcVar11 = strdup(pci_addr);
      (dev_00->ixy).pci_addr = pcVar11;
      bVar23 = 0;
      snprintf(path,0x1000,"/sys/bus/pci/devices/%s/iommu_group");
      uVar10 = (uint)pci_addr;
      __buf = &buffer;
      iVar9 = stat(path,(stat *)__buf);
      uVar24 = (uint16_t)__buf;
      (dev_00->ixy).vfio = iVar9 == 0;
      if (iVar9 != 0) {
LAB_0010547c:
        (dev_00->ixy).driver_name = driver_name;
        (dev_00->ixy).num_rx_queues = rx_queues;
        (dev_00->ixy).num_tx_queues = tx_queues;
        (dev_00->ixy).rx_batch = ixgbe_rx_batch;
        (dev_00->ixy).tx_batch = ixgbe_tx_batch;
        (dev_00->ixy).read_stats = ixgbe_read_stats;
        (dev_00->ixy).set_promisc = ixgbe_set_promisc;
        (dev_00->ixy).get_link_speed = ixgbe_get_link_speed;
        (dev_00->ixy).get_mac_addr = ixgbe_get_mac_addr;
        (dev_00->ixy).set_mac_addr = ixgbe_set_mac_addr;
        (dev_00->ixy).interrupts.interrupts_enabled = interrupt_timeout != 0;
        (dev_00->ixy).interrupts.itr_rate = 0x28;
        (dev_00->ixy).interrupts.timeout_ms = interrupt_timeout;
        if ((interrupt_timeout != 0) && ((bVar23 & 1) == 0)) {
          fprintf(_stderr,
                  "[WARN ] %s:%d %s(): Interrupts requested but VFIO not available: Disabling Interrupts!\n"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,0x22d,"ixgbe_init");
          (dev_00->ixy).interrupts.interrupts_enabled = false;
          bVar23 = (dev_00->ixy).vfio;
        }
        puVar1 = &(dev_00->ixy).num_rx_queues;
        if ((bVar23 & 1) == 0) {
          fprintf(_stderr,"[DEBUG] %s:%d %s(): mapping BAR0 region via pci file...\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,0x238,"ixgbe_init");
          puVar12 = pci_map_resource((char *)dev_01);
          dev_00->addr = puVar12;
        }
        else {
          ixgbe_init_cold_2();
        }
        pvVar13 = calloc((ulong)rx_queues,0x8018);
        dev_00->rx_queues = pvVar13;
        pvVar13 = calloc((ulong)tx_queues,0x8010);
        dev_00->tx_queues = pvVar13;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1bf,"reset_and_init",(dev_00->ixy).pci_addr);
        puVar12 = dev_00->addr;
        puVar12[0x880] = '\0';
        puVar12[0x881] = '\0';
        puVar12[0x882] = '\0';
        puVar12[0x883] = '\0';
        puVar12 = dev_00->addr;
        puVar12[0x888] = 0xff;
        puVar12[0x889] = 0xff;
        puVar12[0x88a] = 0xff;
        puVar12[0x88b] = 0xff;
        puVar12 = dev_00->addr;
        puVar12[0] = '\b';
        puVar12[1] = '\0';
        puVar12[2] = '\0';
        puVar12[3] = '\x04';
        if ((*(uint *)dev_00->addr & 0x4000008) != 0) {
          ixgbe_init_cold_3();
        }
        ppuVar2 = &dev_00->addr;
        usleep(10000);
        puVar12 = dev_00->addr;
        puVar12[0x880] = '\0';
        puVar12[0x881] = '\0';
        puVar12[0x882] = '\0';
        puVar12[0x883] = '\0';
        puVar12 = dev_00->addr;
        puVar12[0x888] = 0xff;
        puVar12[0x889] = 0xff;
        puVar12[0x88a] = 0xff;
        puVar12[0x88b] = 0xff;
        uVar10 = *(uint *)(dev_00->addr + 0x5400);
        uVar19 = *(uint *)(dev_00->addr + 0x5404);
        uVar30 = (ulong)(uVar10 >> 0x18);
        fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1cd,"reset_and_init",(dev_00->ixy).pci_addr,uVar30);
        fprintf(_stdout,"[INFO ] %s:%d %s(): MAC address %02x:%02x:%02x:%02x:%02x:%02x\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1ce,"reset_and_init",(ulong)(uVar10 & 0xff),(ulong)(uVar10 >> 8 & 0xff),
                (ulong)(uVar10 >> 0x10 & 0xff),uVar30,(ulong)(uVar19 & 0xff),
                (ulong)(uVar19 >> 8 & 0xff));
        if ((*(uint *)(dev_00->addr + 0x10010) >> 9 & 1) == 0) {
          ixgbe_init_cold_4();
        }
        if ((*(uint *)(*ppuVar2 + 0x2f00) & 8) == 0) {
          ixgbe_init_cold_5();
        }
        puVar35 = &(dev_00->ixy).num_tx_queues;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) & 0xffff1fff | 0x6000;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) & 0xfffffe7f;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) | 0x1000;
        *(uint *)(*ppuVar2 + 0x3000) = *(uint *)(*ppuVar2 + 0x3000) & 0xfffffffe;
        puVar12 = *ppuVar2;
        puVar12[0x3c00] = '\0';
        puVar12[0x3c01] = '\0';
        puVar12[0x3c02] = '\x02';
        puVar12[0x3c03] = '\0';
        lVar14 = 0;
        do {
          puVar12 = *ppuVar2 + lVar14 * 4 + 0x3c04;
          puVar12[0] = '\0';
          puVar12[1] = '\0';
          puVar12[2] = '\0';
          puVar12[3] = '\0';
          lVar14 = lVar14 + 1;
        } while (lVar14 != 7);
        *(uint *)(*ppuVar2 + 0x4240) = *(uint *)(*ppuVar2 + 0x4240) | 2;
        *(uint *)(*ppuVar2 + 0x2f00) = *(uint *)(*ppuVar2 + 0x2f00) | 2;
        *(uint *)(*ppuVar2 + 0x5080) = *(uint *)(*ppuVar2 + 0x5080) | 0x400;
        if (*puVar1 != 0) {
          ixgbe_init_cold_6();
        }
        *(uint *)(*ppuVar2 + 0x18) = *(uint *)(*ppuVar2 + 0x18) | 0x10000;
        if (*puVar1 != 0) {
          uVar19 = 0x2200;
          uVar10 = 0;
          do {
            uVar27 = uVar19;
            if (0xf < uVar10) {
              if (uVar10 < 0x40) {
                uVar27 = uVar10 * 0x40 | 0x100c;
              }
              else {
                uVar27 = uVar10 * 0x40 + 0xc00c;
              }
            }
            uVar10 = uVar10 + 1;
            uVar19 = uVar19 + 4;
            *(uint *)(*ppuVar2 + uVar27) = *(uint *)(*ppuVar2 + uVar27) & 0xffffefff;
          } while (uVar10 < *puVar1);
        }
        *(uint *)(*ppuVar2 + 0x3000) = *(uint *)(*ppuVar2 + 0x3000) | 1;
        *(uint *)(*ppuVar2 + 0x4240) = *(uint *)(*ppuVar2 + 0x4240) | 0x401;
        puVar12 = *ppuVar2;
        puVar12[0xcc00] = '\0';
        puVar12[0xcc01] = 0xa0;
        puVar12[0xcc02] = '\0';
        puVar12[0xcc03] = '\0';
        lVar14 = 0;
        do {
          puVar12 = *ppuVar2 + lVar14 * 4 + 0xcc04;
          puVar12[0] = '\0';
          puVar12[1] = '\0';
          puVar12[2] = '\0';
          puVar12[3] = '\0';
          lVar14 = lVar14 + 1;
        } while (lVar14 != 7);
        puVar12 = *ppuVar2;
        puVar12[0x8100] = 0xff;
        puVar12[0x8101] = 0xff;
        puVar12[0x8102] = '\0';
        puVar12[0x8103] = '\0';
        *(uint *)(*ppuVar2 + 0x4900) = *(uint *)(*ppuVar2 + 0x4900) & 0xffffffbf;
        if (*puVar35 != 0) {
          ixgbe_init_cold_7();
        }
        puVar12 = *ppuVar2;
        puVar12[0x4a80] = '\x01';
        puVar12[0x4a81] = '\0';
        puVar12[0x4a82] = '\0';
        puVar12[0x4a83] = '\0';
        if (*puVar1 == 0) {
          local_10d2 = 0;
        }
        else {
          ixgbe_init_cold_8();
        }
        if (*puVar35 != 0) {
          lVar32 = 8;
          lVar14 = 0x6028;
          uVar30 = 0;
          do {
            uVar24 = 0x90dd;
            dev_01 = _stderr;
            fprintf(_stderr,"[DEBUG] %s:%d %s(): starting tx queue %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                    ,0x138,"start_tx_queue");
            iVar9 = *(int *)((long)dev_00->tx_queues + lVar32);
            uVar10 = iVar9 - 1;
            if ((ushort)((ushort)iVar9 & (ushort)uVar10) != 0) goto LAB_00105b9f;
            puVar12 = *ppuVar2 + lVar14 + -0x18;
            puVar12[0] = '\0';
            puVar12[1] = '\0';
            puVar12[2] = '\0';
            puVar12[3] = '\0';
            puVar12 = *ppuVar2 + lVar14 + -0x10;
            puVar12[0] = '\0';
            puVar12[1] = '\0';
            puVar12[2] = '\0';
            puVar12[3] = '\0';
            *(uint *)(*ppuVar2 + lVar14) = *(uint *)(*ppuVar2 + lVar14) | 0x2000000;
            if ((*(uint *)(*ppuVar2 + lVar14) >> 0x19 & 1) == 0) {
              ixgbe_init_cold_10();
            }
            uVar30 = uVar30 + 1;
            lVar32 = lVar32 + 0x10;
            lVar14 = lVar14 + 0x40;
          } while (uVar30 < *puVar35);
          local_10d2 = *puVar1;
        }
        if (local_10d2 != 0) {
          uVar24 = 0;
          do {
            enable_interrupt(dev_00,uVar24);
            uVar29 = uVar24 + 1;
            uVar24 = uVar24 + 1;
          } while (uVar29 < (dev_00->ixy).num_rx_queues);
        }
        fprintf(_stdout,"[INFO ] %s:%d %s(): enabling promisc mode\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x271,"ixgbe_set_promisc");
        *(uint *)(*ppuVar2 + 0x5080) = *(uint *)(*ppuVar2 + 0x5080) | 0x300;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1b3,"wait_for_link");
        for (iVar9 = 10000000;
            (((*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e & 1) == 0 ||
             ((*(uint *)(*ppuVar2 + 0x42a4) & 0x30000000) == 0)) && (0 < iVar9));
            iVar9 = iVar9 + -100000) {
          usleep(100000);
        }
        uVar30 = 0;
        if ((*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e & 1) != 0) {
          uVar30 = (ulong)*(uint *)(&DAT_001088b0 +
                                   (ulong)(*(uint *)(*ppuVar2 + 0x42a4) >> 0x1c & 3) * 4);
        }
        fprintf(_stdout,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1ba,"wait_for_link",uVar30);
        return &dev_00->ixy;
      }
      iVar9 = vfio_init((char *)dev_01);
      (dev_00->ixy).vfio_fd = iVar9;
      if (-1 < iVar9) {
        bVar23 = (dev_00->ixy).vfio;
        goto LAB_0010547c;
      }
      goto LAB_00105b96;
    }
  }
  else {
    ixgbe_init_cold_13();
    dev_01 = (FILE *)pci_addr;
  }
  ixgbe_init_cold_12();
LAB_00105b96:
  ixgbe_init_cold_11();
LAB_00105b9f:
  ixgbe_init_cold_9();
  cVar3 = *(char *)&dev_01->_IO_save_end;
  if (cVar3 == '\0') {
    interrupt = (interrupt_queues *)0x0;
  }
  else {
    interrupt = (interrupt_queues *)((long)dev_01->_markers + (ulong)uVar24 * 0x68);
    if (*(char *)((long)dev_01->_markers + (ulong)uVar24 * 0x68 + 8) == '\x01') {
      vfio_epoll_wait(interrupt->vfio_epoll_fd,10,*(int *)((long)&dev_01->_chain + 4));
    }
  }
  if (uVar10 == 0) {
    uVar30 = 0;
  }
  else {
    uVar30 = 0;
    plVar26 = (long *)((ulong)((uint)uVar24 * 0x18) + dev_01->_old_offset);
    uVar29 = *(ushort *)((long)plVar26 + 0x12);
    uVar18 = (ulong)uVar29;
    lVar14 = *plVar26;
    uVar27 = (uint)uVar29;
    uVar28 = (ulong)uVar29 * 0x10;
    uVar19 = *(uint *)(lVar14 + 8 + uVar28);
    if ((uVar19 & 1) != 0) {
      lVar32 = (ulong)uVar10 - 1;
      plVar34 = (long *)(lVar14 + uVar28);
      puVar31 = (uint *)(lVar14 + 8 + uVar28);
      lVar14 = 0;
      uVar22 = uVar18;
      mempool = (mempool *)lVar32;
      do {
        uVar15 = uVar18;
        iVar9 = (int)uVar28;
        if ((uVar19 & 2) == 0) {
          ixgbe_rx_batch_cold_2();
LAB_00105dea:
          ixgbe_rx_batch_cold_1();
          piVar33 = (ixy_device *)(ulong)uVar19;
          plVar26 = (long *)(*(long *)&mempool[5].buf_size + (ulong)(uint)(iVar9 << 4));
          uVar30 = (ulong)*(ushort *)
                           (*(long *)&mempool[5].buf_size + 10 + (ulong)(uint)(iVar9 << 4));
          goto LAB_00105e2c;
        }
        uVar19 = (uint)*(ushort *)((long)plVar34 + 0xe);
        lVar5 = plVar26[uVar22 + 3];
        *(uint *)(lVar5 + 0x14) = (uint)*(ushort *)((long)plVar34 + 0xc);
        mempool = (mempool *)plVar26[1];
        ppVar16 = pkt_buf_alloc(mempool);
        if (ppVar16 == (pkt_buf *)0x0) goto LAB_00105dea;
        *plVar34 = ppVar16->buf_addr_phy + 0x40;
        puVar31[0] = 0;
        puVar31[1] = 0;
        plVar26[uVar22 + 3] = (long)ppVar16;
        *(long *)(extraout_RDX + lVar14 * 8) = lVar5;
        uVar27 = (uint)uVar15;
        uVar19 = (int)plVar26[2] - 1U & uVar27 + 1;
        uVar18 = (ulong)uVar19;
        uVar30 = (ulong)uVar10;
        if (lVar32 == lVar14) break;
        uVar22 = (ulong)(ushort)uVar19;
        lVar14 = lVar14 + 1;
        uVar30 = (ulong)((uVar19 & 0xffff) << 4);
        puVar31 = (uint *)(*plVar26 + 8 + uVar30);
        plVar34 = (long *)(*plVar26 + uVar30);
        uVar19 = *puVar31;
        uVar28 = uVar15;
        uVar30 = lVar14;
      } while ((uVar19 & 1) != 0);
    }
    if ((short)uVar18 != (short)uVar27) {
      uVar19 = (uint)uVar24 * 0x40 + 0xc018;
      if (uVar24 < 0x40) {
        uVar19 = (uint)uVar24 * 0x40 | 0x1018;
      }
      *(uint *)(*(long *)&dev_01->_fileno + (ulong)uVar19) = uVar27 & 0xffff;
      *(short *)((long)plVar26 + 0x12) = (short)uVar18;
    }
  }
  if (cVar3 != '\0') {
    auVar7 = vpmovsxbq_avx(ZEXT216(0x101));
    uVar18 = interrupt->instr_counter;
    auVar6 = vpinsrq_avx(auVar7,uVar30 & 0xffffffff,1);
    auVar7._0_8_ = interrupt->instr_counter;
    auVar7._8_8_ = interrupt->rx_pkts;
    auVar7 = vpaddq_avx(auVar6,auVar7);
    interrupt->instr_counter = auVar7._0_8_;
    interrupt->rx_pkts = auVar7._8_8_;
    if ((uVar18 & 0xfff) == 0) {
      _Var4 = interrupt->interrupt_enabled;
      uVar17 = monotonic_time();
      uVar18 = uVar17 - interrupt->last_time_checked;
      if (interrupt->interval < uVar18) {
        check_interrupt(interrupt,uVar18,(uint32_t)uVar30,uVar10);
      }
      if (_Var4 != interrupt->interrupt_enabled) {
        if (interrupt->interrupt_enabled == false) {
          ixgbe_rx_batch_cold_3();
        }
        else {
          enable_interrupt((ixgbe_device *)dev_01,uVar24);
        }
      }
    }
  }
  return (ixy_device *)(uVar30 & 0xffffffff);
LAB_00105e2c:
  uVar10 = (uint)*(ushort *)((long)plVar26 + 0xc);
  uVar18 = uVar30 & 0xffff;
  uVar27 = (uint)uVar18;
  iVar21 = *(ushort *)((long)plVar26 + 0xc) - uVar27;
  if (iVar21 < 0) {
    iVar21 = iVar21 + (uint)*(ushort *)(plVar26 + 1);
  }
  if (iVar21 < 0x20) goto LAB_00105ea8;
  uVar25 = (uint)*(ushort *)(plVar26 + 1);
  if (uVar27 + 0x1f < uVar25) {
    uVar25 = 0;
  }
  uVar25 = (uVar27 + 0x1f) - uVar25;
  if ((*(uint *)(*plVar26 + 0xc + (long)(int)uVar25 * 0x10) & 1) == 0) goto LAB_00105ea8;
  pkt_buf_free((pkt_buf *)plVar26[uVar18 + 2]);
  while (uVar25 != uVar27) {
    uVar27 = (int)plVar26[1] - 1U & (int)uVar18 + 1U & 0xffff;
    uVar18 = (ulong)uVar27;
    pkt_buf_free((pkt_buf *)plVar26[uVar18 + 2]);
  }
  uVar30 = (ulong)((int)plVar26[1] - 1U & uVar25 + 1);
  goto LAB_00105e2c;
LAB_00105ea8:
  *(ushort *)((long)plVar26 + 10) = (ushort)uVar30;
  if (uVar19 == 0) {
    piVar33 = (ixy_device *)0x0;
  }
  else {
    piVar20 = (ixy_device *)0x0;
    do {
      uVar10 = *(uint *)((long)plVar26 + 0xc);
      uVar29 = (short)(int)plVar26[1] - 1U & (short)uVar10 + 1U;
      if ((ushort)uVar30 == uVar29) {
        piVar33 = (ixy_device *)((ulong)piVar20 & 0xffffffff);
        goto LAB_00105f24;
      }
      plVar34 = *(long **)(extraout_RDX_00 + (long)piVar20 * 8);
      piVar20 = (ixy_device *)((long)&piVar20->pci_addr + 1);
      plVar26[(ulong)(uVar10 & 0xffff) + 2] = (long)plVar34;
      uVar18 = (ulong)((uVar10 & 0xffff) << 4);
      lVar14 = *plVar26;
      *(ushort *)((long)plVar26 + 0xc) = uVar29;
      *(long *)(lVar14 + uVar18) = *plVar34 + 0x40;
      *(uint *)(lVar14 + 8 + uVar18) = *(uint *)((long)plVar34 + 0x14) | 0x2b300000;
      *(int *)(lVar14 + 0xc + uVar18) = *(int *)((long)plVar34 + 0x14) << 0xe;
    } while (piVar33 != piVar20);
    uVar10 = (uint)*(ushort *)((long)plVar26 + 0xc);
LAB_00105f24:
    uVar10 = uVar10 & 0xffff;
  }
  *(uint *)(*(long *)&mempool[4].free_stack_top + 0x6018 + (ulong)(uint)(iVar9 << 6)) = uVar10;
  return piVar33;
}

Assistant:

struct ixy_device* ixgbe_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues, int interrupt_timeout) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > MAX_QUEUES) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, MAX_QUEUES);
	}
	if (tx_queues > MAX_QUEUES) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, MAX_QUEUES);
	}

	// Allocate memory for the ixgbe device that will be returned
	struct ixgbe_device* dev = (struct ixgbe_device*) malloc(sizeof(struct ixgbe_device));
	dev->ixy.pci_addr = strdup(pci_addr);

	// Check if we want the VFIO stuff
	// This is done by checking if the device is in an IOMMU group.
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/iommu_group", pci_addr);
	struct stat buffer;
	dev->ixy.vfio = stat(path, &buffer) == 0;
	if (dev->ixy.vfio) {
		// initialize the IOMMU for this device
		dev->ixy.vfio_fd = vfio_init(pci_addr);
		if (dev->ixy.vfio_fd < 0) {
			error("could not initialize the IOMMU for device %s", pci_addr);
		}
	}
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = ixgbe_rx_batch;
	dev->ixy.tx_batch = ixgbe_tx_batch;
	dev->ixy.read_stats = ixgbe_read_stats;
	dev->ixy.set_promisc = ixgbe_set_promisc;
	dev->ixy.get_link_speed = ixgbe_get_link_speed;
	dev->ixy.get_mac_addr = ixgbe_get_mac_addr;
	dev->ixy.set_mac_addr = ixgbe_set_mac_addr;
	dev->ixy.interrupts.interrupts_enabled = interrupt_timeout != 0;
	// 0x028 (10ys) => 97600 INT/s
	dev->ixy.interrupts.itr_rate = 0x028;
	dev->ixy.interrupts.timeout_ms = interrupt_timeout;

	if (!dev->ixy.vfio && interrupt_timeout != 0) {
		warn("Interrupts requested but VFIO not available: Disabling Interrupts!");
		dev->ixy.interrupts.interrupts_enabled = false;
	}

	// Map BAR0 region
	if (dev->ixy.vfio) {
		debug("mapping BAR0 region via VFIO...");
		dev->addr = vfio_map_region(dev->ixy.vfio_fd, VFIO_PCI_BAR0_REGION_INDEX);
		// initialize interrupts for this device
		setup_interrupts(dev);
	} else {
		debug("mapping BAR0 region via pci file...");
		dev->addr = pci_map_resource(pci_addr);
	}
	dev->rx_queues = calloc(rx_queues, sizeof(struct ixgbe_rx_queue) + sizeof(void*) * MAX_RX_QUEUE_ENTRIES);
	dev->tx_queues = calloc(tx_queues, sizeof(struct ixgbe_tx_queue) + sizeof(void*) * MAX_TX_QUEUE_ENTRIES);
	reset_and_init(dev);
	return &dev->ixy;
}